

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_uint8_srgb4_linearalpha(void *outputp,int width_times_channels,float *encode)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 (*pauVar9) [16];
  char cVar10;
  char *pcVar11;
  undefined1 (*pauVar12) [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar17 [16];
  short sVar21;
  short sVar22;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  short sVar32;
  short sVar33;
  short sVar39;
  short sVar40;
  short sVar41;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  auVar8 = _DAT_005ecd50;
  auVar7 = _DAT_005eccc0;
  auVar6 = _DAT_005eccb0;
  auVar5 = _DAT_005ecca0;
  auVar4 = _DAT_005ecc90;
  pcVar3 = (char *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 0x10) {
    do {
      fVar13 = *encode;
      if (fVar13 <= 0.00012207031) {
        cVar10 = '\0';
      }
      else {
        cVar10 = -1;
        if (fVar13 <= 0.99999994) {
          cVar10 = (char)(((uint)fVar13 >> 0xc & 0xff) *
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] & 0xffff) +
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >>
                         0x10);
        }
      }
      *(char *)outputp = cVar10;
      fVar13 = encode[1];
      if (fVar13 <= 0.00012207031) {
        cVar10 = '\0';
      }
      else {
        cVar10 = -1;
        if (fVar13 <= 0.99999994) {
          cVar10 = (char)(((uint)fVar13 >> 0xc & 0xff) *
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] & 0xffff) +
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >>
                         0x10);
        }
      }
      *(char *)((long)outputp + 1) = cVar10;
      fVar13 = encode[2];
      if (fVar13 <= 0.00012207031) {
        cVar10 = '\0';
      }
      else {
        cVar10 = -1;
        if (fVar13 <= 0.99999994) {
          cVar10 = (char)(((uint)fVar13 >> 0xc & 0xff) *
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] & 0xffff) +
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >>
                         0x10);
        }
      }
      *(char *)((long)outputp + 2) = cVar10;
      fVar14 = encode[3] * 255.0 + 0.5;
      fVar13 = 0.0;
      if (0.0 <= fVar14) {
        fVar13 = fVar14;
      }
      fVar14 = 255.0;
      if (fVar13 <= 255.0) {
        fVar14 = fVar13;
      }
      *(char *)((long)outputp + 3) = (char)(int)fVar14;
      outputp = (void *)((long)outputp + 4);
      encode = encode + 4;
    } while (outputp < pcVar3);
  }
  else {
    pcVar1 = pcVar3 + -0x10;
    fVar13 = (float)DAT_005ecd50;
    fVar14 = DAT_005ecd50._4_4_;
    fVar15 = DAT_005ecd50._8_4_;
    fVar16 = DAT_005ecd50._12_4_;
    pauVar9 = (undefined1 (*) [16])encode;
    do {
      pcVar2 = (char *)((long)outputp + 0x10);
      pcVar11 = pcVar1;
      if (pcVar2 == pcVar3) {
        pcVar11 = pcVar2;
      }
      auVar43 = *pauVar9;
      pauVar12 = (undefined1 (*) [16])(encode + (long)width_times_channels + -0x10);
      if (pcVar2 == pcVar3) {
        pauVar12 = pauVar9 + 4;
      }
      if (pcVar2 <= pcVar1) {
        pcVar11 = pcVar2;
      }
      auVar24 = pauVar9[2];
      if (pcVar2 <= pcVar1) {
        pauVar12 = pauVar9 + 4;
      }
      auVar46._8_4_ = auVar43._4_4_;
      auVar46._0_8_ = auVar43._0_8_;
      auVar46._12_4_ = *(undefined4 *)(pauVar9[1] + 4);
      auVar17._4_4_ = *(undefined4 *)pauVar9[1];
      auVar17._0_4_ = auVar43._0_4_;
      auVar34._8_4_ = auVar24._4_4_;
      auVar34._0_8_ = auVar24._0_8_;
      auVar34._12_4_ = *(undefined4 *)(pauVar9[3] + 4);
      auVar35._8_8_ = auVar34._8_8_;
      auVar17._12_4_ = *(undefined4 *)pauVar9[3];
      auVar17._8_4_ = auVar24._0_4_;
      auVar23._4_4_ = *(undefined4 *)(pauVar9[1] + 8);
      auVar23._0_4_ = auVar43._8_4_;
      auVar23._12_4_ = *(undefined4 *)(pauVar9[3] + 8);
      auVar23._8_4_ = auVar24._8_4_;
      auVar35._0_8_ = auVar46._8_8_;
      auVar17 = maxps(auVar17,auVar4);
      auVar17 = minps(auVar17,auVar5);
      auVar36 = maxps(auVar35,auVar4);
      auVar36 = minps(auVar36,auVar5);
      auVar23 = maxps(auVar23,auVar4);
      auVar23 = minps(auVar23,auVar5);
      auVar42._0_4_ = auVar43._12_4_ * fVar13 + 0.5;
      auVar42._4_4_ = *(float *)(pauVar9[1] + 0xc) * fVar14 + 0.5;
      auVar42._8_4_ = auVar24._12_4_ * fVar15 + 0.5;
      auVar42._12_4_ = *(float *)(pauVar9[3] + 0xc) * fVar16 + 0.5;
      auVar43 = maxps(auVar42,ZEXT816(0));
      auVar43 = minps(auVar43,auVar8);
      auVar44._0_4_ = (int)auVar43._0_4_;
      auVar44._4_4_ = (int)auVar43._4_4_;
      auVar44._8_4_ = (int)auVar43._8_4_;
      auVar44._12_4_ = (int)auVar43._12_4_;
      auVar47._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar17._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar47._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar17._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar47._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar17._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar47._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar17._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar48._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar36._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar48._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar36._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar48._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar36._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar48._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar36._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar45._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar23._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar45._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar23._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar45._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar23._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar45._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar23._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar43._0_4_ = auVar17._0_4_ >> 0xc;
      auVar43._4_4_ = auVar17._4_4_ >> 0xc;
      auVar43._8_4_ = auVar17._8_4_ >> 0xc;
      auVar43._12_4_ = auVar17._12_4_ >> 0xc;
      auVar43 = pmaddwd(auVar43 & auVar6 | auVar7,auVar47);
      auVar24._0_4_ = auVar43._0_4_ >> 0x10;
      auVar24._4_4_ = auVar43._4_4_ >> 0x10;
      auVar24._8_4_ = auVar43._8_4_ >> 0x10;
      auVar24._12_4_ = auVar43._12_4_ >> 0x10;
      auVar37._0_4_ = auVar36._0_4_ >> 0xc;
      auVar37._4_4_ = auVar36._4_4_ >> 0xc;
      auVar37._8_4_ = auVar36._8_4_ >> 0xc;
      auVar37._12_4_ = auVar36._12_4_ >> 0xc;
      auVar43 = pmaddwd(auVar37 & auVar6 | auVar7,auVar48);
      auVar38._0_4_ = auVar43._0_4_ >> 0x10;
      auVar38._4_4_ = auVar43._4_4_ >> 0x10;
      auVar38._8_4_ = auVar43._8_4_ >> 0x10;
      auVar38._12_4_ = auVar43._12_4_ >> 0x10;
      auVar43 = packssdw(auVar24,auVar38);
      auVar36._0_4_ = auVar23._0_4_ >> 0xc;
      auVar36._4_4_ = auVar23._4_4_ >> 0xc;
      auVar36._8_4_ = auVar23._8_4_ >> 0xc;
      auVar36._12_4_ = auVar23._12_4_ >> 0xc;
      auVar24 = pmaddwd(auVar36 & auVar6 | auVar7,auVar45);
      auVar25._0_4_ = auVar24._0_4_ >> 0x10;
      auVar25._4_4_ = auVar24._4_4_ >> 0x10;
      auVar25._8_4_ = auVar24._8_4_ >> 0x10;
      auVar25._12_4_ = auVar24._12_4_ >> 0x10;
      auVar24 = packssdw(auVar25,auVar44);
      sVar28 = auVar24._6_2_;
      sVar41 = auVar43._6_2_;
      sVar27 = auVar24._4_2_;
      sVar40 = auVar43._4_2_;
      sVar26 = auVar24._2_2_;
      sVar39 = auVar43._2_2_;
      sVar22 = auVar24._0_2_;
      sVar33 = auVar43._0_2_;
      sVar18 = auVar43._8_2_;
      sVar29 = auVar24._8_2_;
      sVar19 = auVar43._10_2_;
      sVar30 = auVar24._10_2_;
      sVar20 = auVar43._12_2_;
      sVar31 = auVar24._12_2_;
      sVar21 = auVar43._14_2_;
      sVar32 = auVar24._14_2_;
      *(char *)outputp = (0 < sVar33) * (sVar33 < 0x100) * auVar43[0] - (0xff < sVar33);
      *(char *)((long)outputp + 1) = (0 < sVar18) * (sVar18 < 0x100) * auVar43[8] - (0xff < sVar18);
      *(char *)((long)outputp + 2) = (0 < sVar22) * (sVar22 < 0x100) * auVar24[0] - (0xff < sVar22);
      *(char *)((long)outputp + 3) = (0 < sVar29) * (sVar29 < 0x100) * auVar24[8] - (0xff < sVar29);
      *(char *)((long)outputp + 4) = (0 < sVar39) * (sVar39 < 0x100) * auVar43[2] - (0xff < sVar39);
      *(char *)((long)outputp + 5) = (0 < sVar19) * (sVar19 < 0x100) * auVar43[10] - (0xff < sVar19)
      ;
      *(char *)((long)outputp + 6) = (0 < sVar26) * (sVar26 < 0x100) * auVar24[2] - (0xff < sVar26);
      *(char *)((long)outputp + 7) = (0 < sVar30) * (sVar30 < 0x100) * auVar24[10] - (0xff < sVar30)
      ;
      *(char *)((long)outputp + 8) = (0 < sVar40) * (sVar40 < 0x100) * auVar43[4] - (0xff < sVar40);
      *(char *)((long)outputp + 9) =
           (0 < sVar20) * (sVar20 < 0x100) * auVar43[0xc] - (0xff < sVar20);
      *(char *)((long)outputp + 10) = (0 < sVar27) * (sVar27 < 0x100) * auVar24[4] - (0xff < sVar27)
      ;
      *(char *)((long)outputp + 0xb) =
           (0 < sVar31) * (sVar31 < 0x100) * auVar24[0xc] - (0xff < sVar31);
      *(char *)((long)outputp + 0xc) =
           (0 < sVar41) * (sVar41 < 0x100) * auVar43[6] - (0xff < sVar41);
      *(char *)((long)outputp + 0xd) =
           (0 < sVar21) * (sVar21 < 0x100) * auVar43[0xe] - (0xff < sVar21);
      *(char *)((long)outputp + 0xe) =
           (0 < sVar28) * (sVar28 < 0x100) * auVar24[6] - (0xff < sVar28);
      *(char *)((long)outputp + 0xf) =
           (0 < sVar32) * (sVar32 < 0x100) * auVar24[0xe] - (0xff < sVar32);
      pauVar9 = pauVar12;
      outputp = pcVar11;
    } while (pcVar2 != pcVar3);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb4_linearalpha )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;

      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__min_max_shift20( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__scale_and_convert( i3, f3 );

      stbir__simdi_table_lookup3( i0, i1, i2, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i1, f1 );
      stbir__linear_to_srgb_finish( i2, f2 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      output += 16;
      encode += 16;

      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);

    output[stbir__decode_order0] = stbir__linear_to_srgb_uchar( encode[0] );
    output[stbir__decode_order1] = stbir__linear_to_srgb_uchar( encode[1] );
    output[stbir__decode_order2] = stbir__linear_to_srgb_uchar( encode[2] );

    f = encode[3] * stbir__max_uint8_as_float + 0.5f;
    STBIR_CLAMP(f, 0, 255);
    output[stbir__decode_order3] = (unsigned char) f;

    output += 4;
    encode += 4;
  } while( output < end_output );
}